

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab11.c
# Opt level: O0

int CheckFromArray(void)

{
  int iVar1;
  ulong local_28;
  size_t readItemsCount;
  int cost;
  int weight;
  char *result;
  int knapsackCost;
  
  stream.Out = (FILE *)fopen("out.txt","r");
  if ((FILE *)stream.Out == (FILE *)0x0) {
    printf("can\'t open out.txt\n");
    currentTest = currentTest + 1;
    result._4_4_ = -1;
  }
  else {
    result._0_4_ = 0;
    _cost = ScanInt(stream.Out,(int *)&result);
    if (_cost == "PASSED") {
      if ((uint)result == TestData.Tests[currentTest].KnapsackCost) {
        readItemsCount._4_4_ = 0;
        readItemsCount._0_4_ = 0;
        local_28 = 0;
        _cost = "PASSED";
        while (iVar1 = __isoc99_fscanf(stream.Out,"%d %d",(long)&readItemsCount + 4,&readItemsCount)
              , iVar1 == 2) {
          if (TestData.Tests[currentTest].CountResultItems <= local_28) {
            printf("Output too long -- failed\n");
            return 1;
          }
          if ((*(uint *)(currentTest * 0x478 + 0x106338 + local_28 * 8) != readItemsCount._4_4_) ||
             (*(uint *)(currentTest * 0x478 + 0x10633c + local_28 * 8) != (uint)readItemsCount)) {
            printf("Wrong item output. Found %d %d, but excepted %d %d. -- Failed\n",
                   (ulong)readItemsCount._4_4_,(ulong)(uint)readItemsCount,
                   (ulong)*(uint *)(currentTest * 0x478 + 0x106338 + local_28 * 8),
                   (ulong)*(uint *)(currentTest * 0x478 + 0x10633c + local_28 * 8));
            return 1;
          }
          local_28 = local_28 + 1;
        }
        if (local_28 < TestData.Tests[currentTest].CountResultItems) {
          printf("Output too short -- Failed\n");
          result._4_4_ = 1;
        }
        else {
          printf("PASSED\n");
          currentTest = currentTest + 1;
          fclose((FILE *)stream.Out);
          result._4_4_ = 0;
        }
      }
      else {
        printf("Wrong knapsack cost output. Found %d, but excepted %d. -- Failed\n",
               (ulong)(uint)result,(ulong)(uint)TestData.Tests[currentTest].KnapsackCost);
        result._4_4_ = 1;
      }
    }
    else {
      result._4_4_ = 1;
    }
  }
  return result._4_4_;
}

Assistant:

static int CheckFromArray(void) {
    stream.Out = fopen("out.txt", "r");
    if (!stream.Out) {
        printf("can't open out.txt\n");
        currentTest++;
        return -1;
    }
    int knapsackCost = 0;
    const char* result = ScanInt(stream.Out, &knapsackCost);
    if (result != Pass) {
        return 1;
    }
    if (knapsackCost != TestData.Tests[currentTest].KnapsackCost) {
        printf("Wrong knapsack cost output. Found %d, but excepted %d. -- Failed\n", knapsackCost, TestData.Tests[currentTest].KnapsackCost);
        return 1;
    }
    
    int weight = 0, cost = 0;
    size_t readItemsCount = 0;
    while(fscanf(stream.Out, "%d %d", &weight, &cost) == 2) {
        if (readItemsCount >= TestData.Tests[currentTest].CountResultItems) {
            printf("Output too long -- failed\n");
            return 1;
        }
        if (TestData.Tests[currentTest].Result[readItemsCount].Weight != weight || TestData.Tests[currentTest].Result[readItemsCount].Cost != cost) {
            printf("Wrong item output. Found %d %d, but excepted %d %d. -- Failed\n", weight, cost, TestData.Tests[currentTest].Result[readItemsCount].Weight, TestData.Tests[currentTest].Result[readItemsCount].Cost);
            return 1;
        }
        ++readItemsCount;
    }
    if (readItemsCount < TestData.Tests[currentTest].CountResultItems) {
        printf("Output too short -- Failed\n");
        return 1;
    }
    printf("PASSED\n");
    ++currentTest;
    fclose(stream.Out);
    return 0;
}